

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int jsonEachConnect(sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVtab,char **pzErr)

{
  int iVar1;
  sqlite3_vtab *psVar2;
  
  iVar1 = sqlite3_declare_vtab
                    (db,
                     "CREATE TABLE x(key,value,type,atom,id,parent,fullkey,path,json HIDDEN,root HIDDEN)"
                    );
  if (iVar1 == 0) {
    iVar1 = sqlite3_initialize();
    if (iVar1 == 0) {
      psVar2 = (sqlite3_vtab *)sqlite3Malloc(0x18);
      *ppVtab = psVar2;
      if (psVar2 != (sqlite3_vtab *)0x0) {
        psVar2->pModule = (sqlite3_module *)0x0;
        *(undefined8 *)&psVar2->nRef = 0;
        psVar2->zErrMsg = (char *)0x0;
        sqlite3_vtab_config(db,2);
        return 0;
      }
    }
    else {
      *ppVtab = (sqlite3_vtab *)0x0;
    }
    iVar1 = 7;
  }
  return iVar1;
}

Assistant:

static int jsonEachConnect(
  sqlite3 *db,
  void *pAux,
  int argc, const char *const*argv,
  sqlite3_vtab **ppVtab,
  char **pzErr
){
  sqlite3_vtab *pNew;
  int rc;

/* Column numbers */
#define JEACH_KEY     0
#define JEACH_VALUE   1
#define JEACH_TYPE    2
#define JEACH_ATOM    3
#define JEACH_ID      4
#define JEACH_PARENT  5
#define JEACH_FULLKEY 6
#define JEACH_PATH    7
/* The xBestIndex method assumes that the JSON and ROOT columns are
** the last two columns in the table.  Should this ever changes, be
** sure to update the xBestIndex method. */
#define JEACH_JSON    8
#define JEACH_ROOT    9

  UNUSED_PARAMETER(pzErr);
  UNUSED_PARAMETER(argv);
  UNUSED_PARAMETER(argc);
  UNUSED_PARAMETER(pAux);
  rc = sqlite3_declare_vtab(db,
     "CREATE TABLE x(key,value,type,atom,id,parent,fullkey,path,"
                    "json HIDDEN,root HIDDEN)");
  if( rc==SQLITE_OK ){
    pNew = *ppVtab = sqlite3_malloc( sizeof(*pNew) );
    if( pNew==0 ) return SQLITE_NOMEM;
    memset(pNew, 0, sizeof(*pNew));
    sqlite3_vtab_config(db, SQLITE_VTAB_INNOCUOUS);
  }
  return rc;
}